

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

void __thiscall
libcellml::Generator::GeneratorImpl::addImplementationVoiInfoCode(GeneratorImpl *this)

{
  long *plVar1;
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Type TVar3;
  undefined8 *puVar4;
  char *pcVar5;
  ulong uVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  VariablePtr voiVariable;
  string type;
  string component;
  string name;
  string units;
  long *local_1d0;
  long local_1c0;
  undefined8 uStack_1b8;
  Variable *local_1b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a8;
  string local_1a0;
  ulong *local_180;
  long local_178;
  ulong local_170 [2];
  string local_160;
  string local_140;
  undefined1 local_120 [32];
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  TVar3 = AnalyserModel::type((this->mModel).
                              super___shared_ptr<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
  if (((TVar3 == ODE) || (TVar3 == DAE)) &&
     (GeneratorProfile::implementationVoiInfoString_abi_cxx11_
                (&local_60,
                 (this->mProfile).
                 super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
     , local_60._M_string_length != 0)) {
    GeneratorProfile::variableInfoEntryString_abi_cxx11_
              (&local_80,
               (this->mProfile).
               super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (local_80._M_string_length == 0) {
      bVar9 = true;
      goto LAB_001ee338;
    }
    GeneratorProfile::variableOfIntegrationVariableTypeString_abi_cxx11_
              (&local_40,
               (this->mProfile).
               super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    bVar8 = local_40._M_string_length != 0;
    bVar9 = true;
    bVar2 = true;
  }
  else {
    bVar9 = false;
LAB_001ee338:
    bVar2 = false;
    bVar8 = false;
  }
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2)) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((bVar9) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2)) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (((TVar3 == ODE) || (TVar3 == DAE)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2)) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (!bVar8) {
    return;
  }
  AnalyserModel::voi((AnalyserModel *)local_120);
  AnalyserVariable::variable((AnalyserVariable *)local_120._0_8_);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_);
  }
  NamedEntity::name_abi_cxx11_((string *)local_120,&local_1b0->super_NamedEntity);
  Variable::units(local_1b0);
  NamedEntity::name_abi_cxx11_(&local_a0,(NamedEntity *)local_140._M_dataplus._M_p);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._M_string_length);
  }
  this_00 = local_1a8;
  if (local_1a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_1a8->_M_use_count = local_1a8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_1a8->_M_use_count = local_1a8->_M_use_count + 1;
    }
  }
  owningComponent((ParentedEntityConstPtr *)&local_160);
  NamedEntity::name_abi_cxx11_(&local_140,(NamedEntity *)local_160._M_dataplus._M_p);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._M_string_length);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  GeneratorProfile::variableOfIntegrationVariableTypeString_abi_cxx11_
            (&local_160,
             (this->mProfile).
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar9 = (this->mCode)._M_string_length != 0;
  pcVar5 = "";
  if (bVar9) {
    pcVar5 = "\n";
  }
  local_180 = local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,pcVar5,pcVar5 + bVar9);
  GeneratorProfile::implementationVoiInfoString_abi_cxx11_
            (&local_c0,
             (this->mProfile).
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"[CODE]","");
  generateVariableInfoEntryCode(&local_e0,this,(string *)local_120,&local_a0,&local_140,&local_160);
  replace(&local_1a0,&local_c0,&local_100,&local_e0);
  uVar6 = 0xf;
  if (local_180 != local_170) {
    uVar6 = local_170[0];
  }
  if (uVar6 < local_1a0._M_string_length + local_178) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      uVar7 = local_1a0.field_2._M_allocated_capacity;
    }
    if (local_1a0._M_string_length + local_178 <= (ulong)uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,(ulong)local_180);
      goto LAB_001ee5d0;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_1a0._M_dataplus._M_p);
LAB_001ee5d0:
  local_1d0 = &local_1c0;
  plVar1 = puVar4 + 2;
  if ((long *)*puVar4 == plVar1) {
    local_1c0 = *plVar1;
    uStack_1b8 = puVar4[3];
  }
  else {
    local_1c0 = *plVar1;
    local_1d0 = (long *)*puVar4;
  }
  *puVar4 = plVar1;
  puVar4[1] = 0;
  *(undefined1 *)plVar1 = 0;
  std::__cxx11::string::_M_append((char *)&this->mCode,(ulong)local_1d0);
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_180 != local_170) {
    operator_delete(local_180,local_170[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((AnalyserModelImpl *)local_120._0_8_ != (AnalyserModelImpl *)(local_120 + 0x10)) {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  if (local_1a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8);
  }
  return;
}

Assistant:

void Generator::GeneratorImpl::addImplementationVoiInfoCode()
{
    if (modelHasOdes()
        && !mProfile->implementationVoiInfoString().empty()
        && !mProfile->variableInfoEntryString().empty()
        && !mProfile->variableOfIntegrationVariableTypeString().empty()) {
        auto voiVariable = mModel->voi()->variable();
        auto name = voiVariable->name();
        auto units = voiVariable->units()->name();
        auto component = owningComponent(voiVariable)->name();
        auto type = mProfile->variableOfIntegrationVariableTypeString();

        mCode += newLineIfNeeded()
                 + replace(mProfile->implementationVoiInfoString(),
                           "[CODE]", generateVariableInfoEntryCode(name, units, component, type));
    }
}